

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

bool __thiscall HModel::OKtoSolve(HModel *this,int level,int phase)

{
  byte bVar1;
  reference pvVar2;
  undefined4 in_EDX;
  uint in_ESI;
  long in_RDI;
  int var;
  bool ok;
  int in_stack_000000b4;
  HModel *in_stack_000000b8;
  int in_stack_00000114;
  HModel *in_stack_00000118;
  bool local_21;
  int in_stack_ffffffffffffffe0;
  uint uVar3;
  undefined3 in_stack_ffffffffffffffe4;
  int XnumCol;
  bool local_1;
  
  local_21 = false;
  if ((((*(int *)(in_RDI + 0x5e0) != 0) && (local_21 = false, *(int *)(in_RDI + 0x5e4) != 0)) &&
      (local_21 = false, *(int *)(in_RDI + 0x5e8) != 0)) &&
     ((local_21 = false, *(int *)(in_RDI + 0x5ec) != 0 &&
      (local_21 = false, *(int *)(in_RDI + 0x5f0) != 0)))) {
    local_21 = *(int *)(in_RDI + 0x5f4) != 0;
  }
  XnumCol = CONCAT13(local_21,in_stack_ffffffffffffffe4);
  if (local_21 == false) {
    if (*(int *)(in_RDI + 0x5e0) == 0) {
      printf("Not OK to solve since mlFg_haveBasis = %d\n",(ulong)*(uint *)(in_RDI + 0x5e0));
    }
    if (*(int *)(in_RDI + 0x5e4) == 0) {
      printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n",(ulong)*(uint *)(in_RDI + 0x5e4))
      ;
    }
    if (*(int *)(in_RDI + 0x5e8) == 0) {
      printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n",(ulong)*(uint *)(in_RDI + 0x5e8)
            );
    }
    if (*(int *)(in_RDI + 0x5ec) == 0) {
      printf("Not OK to solve since mlFg_haveFactorArrays = %d\n",(ulong)*(uint *)(in_RDI + 0x5ec));
    }
    if (*(int *)(in_RDI + 0x5f0) == 0) {
      printf("Not OK to solve since mlFg_haveEdWt = %d\n",(ulong)*(uint *)(in_RDI + 0x5f0));
    }
    if (*(int *)(in_RDI + 0x5f4) == 0) {
      printf("Not OK to solve since mlFg_haveInvert = %d\n",(ulong)*(uint *)(in_RDI + 0x5f4));
    }
    std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  }
  if ((int)in_ESI < 1) {
    local_1 = (bool)((byte)((uint)XnumCol >> 0x18) & 1);
  }
  else {
    bVar1 = nonbasicFlagBasicIndex_OK
                      ((HModel *)CONCAT44(in_ESI,in_EDX),XnumCol,in_stack_ffffffffffffffe0);
    if ((bool)bVar1) {
      bVar1 = workArrays_OK(in_stack_000000b8,in_stack_000000b4);
      if ((bool)bVar1) {
        for (uVar3 = 0; (int)uVar3 < *(int *)(in_RDI + 0x614); uVar3 = uVar3 + 1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)uVar3
                             );
          if ((*pvVar2 != 0) &&
             (bVar1 = oneNonbasicMoveVsWorkArrays_OK(in_stack_00000118,in_stack_00000114),
             !(bool)bVar1)) {
            printf("Error in nonbasicMoveVsWorkArrays for variable %d\n",(ulong)uVar3);
            std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
            return (bool)(bVar1 & 1);
          }
        }
        if ((int)in_ESI < 2) {
          local_1 = (bool)(bVar1 & 1);
        }
        else {
          printf("OKtoSolve(%1d) not implemented\n",(ulong)in_ESI);
          std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
          local_1 = (bool)(bVar1 & 1);
        }
      }
      else {
        printf("Error in workArrays\n");
        std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
        local_1 = (bool)(bVar1 & 1);
      }
    }
    else {
      printf("Error in nonbasicFlag and basicIndex\n");
      std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
      local_1 = (bool)(bVar1 & 1);
    }
  }
  return local_1;
}

Assistant:

bool HModel::OKtoSolve(int level, int phase) {
  //  printf("Called OKtoSolve(%1d, %1d)\n", level, phase);
  bool ok;
  // Level 0: Minimal check - just look at flags. This means we trust them!
  ok = mlFg_haveBasis
    && mlFg_haveMatrixColWise
    && mlFg_haveMatrixRowWise 
    && mlFg_haveFactorArrays
    && mlFg_haveEdWt
    && mlFg_haveInvert
    ;
  if (!ok) {
    if (!mlFg_haveBasis) printf("Not OK to solve since mlFg_haveBasis = %d\n", mlFg_haveBasis);
    if (!mlFg_haveMatrixColWise) printf("Not OK to solve since mlFg_haveMatrixColWise = %d\n", mlFg_haveMatrixColWise);
    if (!mlFg_haveMatrixRowWise) printf("Not OK to solve since mlFg_haveMatrixRowWise  = %d\n", mlFg_haveMatrixRowWise);
    if (!mlFg_haveFactorArrays) printf("Not OK to solve since mlFg_haveFactorArrays = %d\n", mlFg_haveFactorArrays);
    if (!mlFg_haveEdWt) printf("Not OK to solve since mlFg_haveEdWt = %d\n", mlFg_haveEdWt);
    if (!mlFg_haveInvert) printf("Not OK to solve since mlFg_haveInvert = %d\n", mlFg_haveInvert);
    cout << flush;
  }
#ifdef JAJH_dev
  assert(ok);
#endif
  if (level <= 0) return ok;
  // Level 1: Basis and data check
  ok = nonbasicFlagBasicIndex_OK(numCol, numRow);
  if (!ok) {
    printf("Error in nonbasicFlag and basicIndex\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  ok = workArrays_OK(phase);
  if (!ok) {
    printf("Error in workArrays\n");cout << flush;
#ifdef JAJH_dev
    assert(ok);
#endif
    return ok;
  }
  for (int var = 0; var < numTot; ++var) {
    if (nonbasicFlag[var]) {
      //Nonbasic variable
      ok = oneNonbasicMoveVsWorkArrays_OK(var);
      if (!ok) {
	printf("Error in nonbasicMoveVsWorkArrays for variable %d\n", var);cout << flush;
#ifdef JAJH_dev
	assert(ok);
#endif
	return ok;
      }
    } 
  }
  if (level <= 1) return ok;
  printf("OKtoSolve(%1d) not implemented\n", level);cout << flush;
  return ok;
}